

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O0

void __thiscall
QEglFSKmsGbmScreen::cloneDestFlipFinished
          (QEglFSKmsGbmScreen *this,QEglFSKmsGbmScreen *cloneDestScreen)

{
  bool bVar1;
  iterator o;
  CloneDestination *pCVar2;
  QEglFSKmsGbmScreen *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  CloneDestination *d;
  QList<QEglFSKmsGbmScreen::CloneDestination> *__range1;
  iterator __end1;
  iterator __begin1;
  QList<QEglFSKmsGbmScreen::CloneDestination> *in_stack_ffffffffffffffc0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (CloneDestination *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QEglFSKmsGbmScreen::CloneDestination>::begin(in_stack_ffffffffffffffc0);
  o = QList<QEglFSKmsGbmScreen::CloneDestination>::end(in_stack_ffffffffffffffc0);
  do {
    bVar1 = QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator!=(&local_10,o);
    if (!bVar1) {
LAB_0011d21e:
      (**(code **)(*in_RDI + 0x108))();
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    pCVar2 = QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator*(&local_10);
    if (pCVar2->screen == in_RSI) {
      pCVar2->cloneFlipPending = false;
      goto LAB_0011d21e;
    }
    QList<QEglFSKmsGbmScreen::CloneDestination>::iterator::operator++(&local_10);
  } while( true );
}

Assistant:

void QEglFSKmsGbmScreen::cloneDestFlipFinished(QEglFSKmsGbmScreen *cloneDestScreen)
{
    for (CloneDestination &d : m_cloneDests) {
        if (d.screen == cloneDestScreen) {
            d.cloneFlipPending = false;
            break;
        }
    }
    updateFlipStatus();
}